

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_sine.c
# Opt level: O1

int patestCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                  PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,
                  void *userData)

{
  bool bVar1;
  unsigned_long uVar2;
  int iVar3;
  float *out;
  int iVar4;
  int iVar5;
  
  if (framesPerBuffer != 0) {
    iVar3 = *(int *)((long)userData + 800);
    iVar4 = *(int *)((long)userData + 0x324);
    uVar2 = 0;
    do {
      *(undefined4 *)((long)outputBuffer + uVar2 * 8) =
           *(undefined4 *)((long)userData + (long)iVar3 * 4);
      iVar5 = iVar3 + 1;
      bVar1 = iVar3 < 199;
      iVar3 = iVar3 + -199;
      if (bVar1) {
        iVar3 = iVar5;
      }
      *(undefined4 *)((long)outputBuffer + uVar2 * 8 + 4) =
           *(undefined4 *)((long)userData + (long)iVar4 * 4);
      iVar5 = iVar4 + 3;
      bVar1 = iVar4 < 0xc5;
      iVar4 = iVar4 + -0xc5;
      if (bVar1) {
        iVar4 = iVar5;
      }
      uVar2 = uVar2 + 1;
    } while (framesPerBuffer != uVar2);
    *(int *)((long)userData + 800) = iVar3;
    *(int *)((long)userData + 0x324) = iVar4;
  }
  return 0;
}

Assistant:

static int patestCallback( const void *inputBuffer, void *outputBuffer,
                            unsigned long framesPerBuffer,
                            const PaStreamCallbackTimeInfo* timeInfo,
                            PaStreamCallbackFlags statusFlags,
                            void *userData )
{
    paTestData *data = (paTestData*)userData;
    float *out = (float*)outputBuffer;
    unsigned long i;

    (void) timeInfo; /* Prevent unused variable warnings. */
    (void) statusFlags;
    (void) inputBuffer;
    
    for( i=0; i<framesPerBuffer; i++ )
    {
        *out++ = data->sine[data->left_phase];  /* left */
        *out++ = data->sine[data->right_phase];  /* right */
        data->left_phase += 1;
        if( data->left_phase >= TABLE_SIZE ) data->left_phase -= TABLE_SIZE;
        data->right_phase += 3; /* higher pitch so we can distinguish left and right. */
        if( data->right_phase >= TABLE_SIZE ) data->right_phase -= TABLE_SIZE;
    }
    
    return paContinue;
}